

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_type_info.hpp
# Opt level: O2

void __thiscall duckdb::LogicalTypeModifier::~LogicalTypeModifier(LogicalTypeModifier *this)

{
  ::std::__cxx11::string::~string((string *)&this->label);
  Value::~Value(&this->value);
  return;
}

Assistant:

explicit LogicalTypeModifier(Value value_p) : value(std::move(value_p)) {
	}